

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O0

Link * __thiscall Link::find(Link *this,string *s)

{
  __type _Var1;
  Link *local_28;
  Link *p;
  string *s_local;
  Link *this_local;
  
  local_28 = this;
  while( true ) {
    if (local_28 == (Link *)0x0) {
      return (Link *)0x0;
    }
    _Var1 = std::operator==(&local_28->value,s);
    if (_Var1) break;
    local_28 = local_28->succ;
  }
  return local_28;
}

Assistant:

Link* Link::find(const std::string& s)
{
	Link* p = this;
	while (p)
	{
		if (p->value == s)
			return p;
		p = p->succ;
	}
	return nullptr;
}